

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

void lyds_unlink(lyd_node **leader,lyd_node *node)

{
  long lVar1;
  lyd_meta *local_30;
  lyd_meta *root_meta;
  rb_node *removed;
  rb_node *rbt;
  lyd_node *node_local;
  lyd_node **leader_local;
  
  root_meta = (lyd_meta *)0x0;
  if (((((node != (lyd_node *)0x0) && (leader != (lyd_node **)0x0)) && (*leader != (lyd_node *)0x0))
      && ((rbt = (rb_node *)node, node_local = (lyd_node *)leader,
          removed = lyds_get_rb_tree(*leader,&local_30), local_30 != (lyd_meta *)0x0 &&
          (lVar1._0_4_ = node_local->hash, lVar1._4_4_ = node_local->flags,
          *(long *)(*(long *)node_local + 0x20) != lVar1)))) &&
     ((*(long *)(*(long *)(*(long *)node_local + 0x20) + 8) == *(long *)(*(long *)node_local + 8) ||
      ((*(long *)(*(long *)node_local + 0x18) != 0 &&
       (*(long *)(*(long *)node_local + 8) == *(long *)(*(long *)(*(long *)node_local + 0x18) + 8)))
      )))) {
    if (*(rb_node **)node_local == rbt) {
      lyds_move_meta(*(lyd_node **)(*(long *)node_local + 0x18),local_30);
    }
    rb_remove_node(local_30,&removed,(lyd_node *)rbt,(rb_node **)&root_meta);
    rb_free_node((rb_node **)&root_meta);
  }
  return;
}

Assistant:

void
lyds_unlink(struct lyd_node **leader, struct lyd_node *node)
{
    struct rb_node *rbt, *removed = NULL;
    struct lyd_meta *root_meta;

    if (!node || !leader || !*leader) {
        return;
    }

    /* get the Red-black tree from the leader */
    rbt = lyds_get_rb_tree(*leader, &root_meta);

    /* find out if leader_p is alone */
    if (!root_meta || LYD_NODE_IS_ALONE(*leader)) {
        return;
    }

    if (*leader == node) {
        /* move the metadata to the next instance. */
        lyds_move_meta((*leader)->next, root_meta);
    }

    rb_remove_node(root_meta, &rbt, node, &removed);
    rb_free_node(&removed);
}